

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

void __thiscall LengauerTarjan::DFS(LengauerTarjan *this,int v)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference piVar4;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int w;
  iterator it;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  value_type in_stack_ffffffffffffffb0;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  value_type local_c;
  
  *(int *)&in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage =
       *(int *)&in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
  vVar5 = *(value_type *)
           &in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  local_c = in_ESI;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  *pvVar3 = vVar5;
  vVar6 = local_c;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (long)*(int *)&in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
  *pvVar3 = vVar6;
  vVar7 = local_c;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 9,(long)local_c);
  *pvVar3 = vVar7;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 8,(long)local_c);
  *pvVar3 = -1;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[](&succs,(long)local_c);
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&succs,(long)local_c);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(vVar5,in_stack_ffffffffffffffb0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa8);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    iVar1 = *piVar4;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)iVar1);
    if (*pvVar3 == -1) {
      in_stack_ffffffffffffffb0 = local_c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)iVar1);
      *pvVar3 = in_stack_ffffffffffffffb0;
      (**(code **)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start)(in_RDI,iVar1);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&preds,(long)iVar1);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_RDI,(value_type_conflict *)CONCAT44(vVar7,vVar6));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(vVar7,vVar6),vVar5);
  }
  return;
}

Assistant:

void LengauerTarjan::DFS(int v) {
	// cout <<"DFS at "<<v<<endl;
	count = count + 1;
	semi[v] = count;
	vertex[count] = v;
	// Init vars for step 3 and 4
	label[v] = v;
	ancestor[v] = -1;
	std::vector<int>::iterator it;
	for (it = succs[v].begin(); it != succs[v].end(); it++) {
		const int w = *it;
		if (semi[w] == -1) {
			parent[w] = v;
			DFS(w);
		}
		preds[w].push_back(v);
	}
}